

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,int i)

{
  char *buffer;
  char *pcVar1;
  
  buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0xb);
  pcVar1 = internal::i32toa(i,buffer);
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>
            (&this->os_->stack_,(size_t)(buffer + (0xb - (long)pcVar1)));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteInt(int i) {
    char *buffer = os_->Push(11);
    const char* end = internal::i32toa(i, buffer);
    os_->Pop(static_cast<size_t>(11 - (end - buffer)));
    return true;
}